

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O2

void __thiscall
num_parse_test_serial_parse_floating_Test::TestBody(num_parse_test_serial_parse_floating_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  double res;
  array<unsigned_char,_8UL> bytes;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"2.5",(allocator<char> *)&res);
  bytes = mvm::num::serial<double,8ul,mvm::num::big_endian_tag>((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  res = mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(bytes._M_elems);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4004000000000000
  ;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"res","2.5",&res,(double *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0xaa,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"-2.5",(allocator<char> *)&local_48);
  bytes = mvm::num::serial<double,8ul,mvm::num::big_endian_tag>((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  res = mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(bytes._M_elems);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc004000000000000
  ;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"res","-2.5",&res,(double *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0xaf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(num_parse_test, serial_parse_floating) {
  auto bytes = serial<double, 8, big_endian_tag>("2.5");
  auto res = parse<double, 8, big_endian_tag>(&bytes[0]);

  EXPECT_EQ(res, 2.5);

  bytes = serial<double, 8, big_endian_tag>("-2.5");
  res = parse<double, 8, big_endian_tag>(&bytes[0]);

  EXPECT_EQ(res, -2.5);
}